

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,int radix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = CONCAT44(0,radix);
  lVar3 = 0;
  do {
    pcVar6 = this->cursor_;
    if (this->end_ <= pcVar6 + lVar3) goto LAB_0011d51d;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = number;
    bVar4 = SUB161(auVar2 % auVar1,0);
    bVar5 = bVar4 + 0x57;
    if (SUB168(auVar2 % auVar1,0) < 10) {
      bVar5 = bVar4 | 0x30;
    }
    pcVar6[lVar3] = bVar5;
    lVar3 = lVar3 + 1;
    bVar8 = uVar7 <= number;
    number = number / uVar7;
  } while (bVar8);
  pcVar6 = this->cursor_;
LAB_0011d51d:
  std::__reverse<char*>(pcVar6,pcVar6 + (int)lVar3);
  this->cursor_ = this->cursor_ + (int)lVar3;
  return;
}

Assistant:

void AppendUint64(uint64 number, int radix) {
    int i = 0;
    while (cursor_ + i < end_) {
      const int tmp = number % radix;
      number /= radix;
      cursor_[i] = (tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }